

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

void Saig_ManCexMinCollectFrameTerms_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vFrameCisOne)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  do {
    if (pObj->TravId == pAig->nTravIds) {
      return;
    }
    pObj->TravId = pAig->nTravIds;
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar1 = uVar2 & 7;
    lVar3 = 8;
    if (uVar1 != 3) {
      if ((uVar2 & 7) - 7 < 0xfffffffe) {
        if (uVar1 != 2) {
          return;
        }
        Vec_IntPush(vFrameCisOne,pObj->Id);
        return;
      }
      Saig_ManCexMinCollectFrameTerms_rec
                (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vFrameCisOne);
      lVar3 = 0x10;
    }
    pObj = (Aig_Obj_t *)(*(ulong *)((long)&pObj->field_0 + lVar3) & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

void Saig_ManCexMinCollectFrameTerms_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vFrameCisOne )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
    else if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin1(pObj), vFrameCisOne );
    }
    else if ( Aig_ObjIsCi(pObj) )
        Vec_IntPush( vFrameCisOne, Aig_ObjId(pObj) );
}